

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O3

void update_coeff_general
               (int *accu_rate,int64_t *accu_dist,int si,int eob,TX_SIZE tx_size,TX_CLASS tx_class,
               int bhl,int width,int64_t rdmult,int shift,int dc_sign_ctx,int16_t *dequant,
               int16_t *scan,LV_MAP_COEFF_COST *txb_costs,tran_low_t *tcoeff,tran_low_t *qcoeff,
               tran_low_t *dqcoeff,uint8_t *levels,qm_val_t *iqmatrix,qm_val_t *qmatrix)

{
  short sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  uint abs_qc;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint is_last;
  byte *pbVar18;
  bool bVar19;
  
  sVar1 = scan[si];
  lVar15 = (long)sVar1;
  iVar12 = (int)dequant[lVar15 != 0];
  if (iqmatrix != (qm_val_t *)0x0) {
    iVar12 = (int)((uint)iqmatrix[lVar15] * iVar12 + 0x10) >> 5;
  }
  iVar3 = qcoeff[lVar15];
  bVar19 = eob + -1 == si;
  bVar5 = (byte)bhl;
  if (bVar19) {
    if (si != 0) {
      iVar11 = width << (bVar5 & 0x1f);
      uVar10 = 1;
      if (iVar11 >> 3 < si) {
        uVar10 = iVar11 >> 2 < si | 2;
      }
      goto LAB_0024b4a6;
    }
  }
  else {
    iVar11 = (int)sVar1 >> (bVar5 & 0x1f);
    lVar8 = (long)((int)sVar1 + iVar11 * 4);
    lVar16 = (long)(1 << (bVar5 & 0x1f));
    iVar14 = (uint)""[levels[lVar8 + 1]] + (uint)""[levels[lVar16 + 4 + lVar8]];
    if (tx_class == '\x02') {
      iVar14 = iVar14 + (uint)""[levels[lVar8 + 3]] + (uint)""[levels[lVar8 + 2]];
      pbVar18 = levels + lVar8 + 4;
    }
    else if (tx_class == '\0') {
      iVar14 = iVar14 + (uint)""[levels[(long)(2 << (bVar5 & 0x1f)) + lVar8 + 8]] +
                        (uint)""[levels[lVar16 + lVar8 + 5]];
      pbVar18 = levels + lVar8 + 2;
    }
    else {
      iVar14 = iVar14 + (uint)""[levels[(long)(3 << (bVar5 & 0x1f)) + lVar8 + 0xc]] +
                        (uint)""[levels[(long)(2 << (bVar5 & 0x1f)) + lVar8 + 8]];
      pbVar18 = levels + (4 << (bVar5 & 0x1f)) + lVar8 + 0x10;
    }
    if (sVar1 != 0 || tx_class != '\0') {
      uVar10 = (uint)""[*pbVar18] + iVar14 + 1 >> 1;
      uVar13 = 4;
      if (uVar10 < 4) {
        uVar13 = uVar10;
      }
      if (tx_class == '\x02') {
        uVar10 = uVar13 + nz_map_ctx_offset_1d[(uint)(~(-1 << (bVar5 & 0x1f)) & (int)sVar1)];
      }
      else {
        if (tx_class == '\x01') {
          iVar11 = nz_map_ctx_offset_1d[iVar11];
        }
        else {
          uVar10 = 0;
          if (tx_class != '\0') goto LAB_0024b4a6;
          iVar11 = (int)av1_nz_map_ctx_offset[tx_size][lVar15];
        }
        uVar10 = uVar13 + iVar11;
      }
      goto LAB_0024b4a6;
    }
  }
  uVar10 = 0;
LAB_0024b4a6:
  if (iVar3 == 0) {
    *accu_rate = *accu_rate + txb_costs->base_cost[(int)uVar10][0];
  }
  else {
    uVar13 = iVar3 >> 0x1f;
    iVar14 = -uVar13;
    iVar11 = -iVar3;
    if (0 < iVar3) {
      iVar11 = iVar3;
    }
    iVar3 = tcoeff[lVar15];
    bVar6 = (byte)shift;
    lVar8 = (long)(iVar3 - dqcoeff[lVar15] << (bVar6 & 0x1f));
    if (qmatrix == (qm_val_t *)0x0) {
      uVar9 = lVar8 * lVar8;
      lVar8 = (long)(iVar3 << (bVar6 & 0x1f));
      uVar17 = lVar8 * lVar8;
    }
    else {
      lVar8 = lVar8 * (ulong)qmatrix[lVar15];
      uVar9 = lVar8 * lVar8 + 0x200U >> 10;
      lVar8 = (long)(iVar3 << (bVar6 & 0x1f)) * (ulong)qmatrix[lVar15];
      uVar17 = lVar8 * lVar8 + 0x200U >> 10;
    }
    is_last = (uint)bVar19;
    iVar2 = get_coeff_cost_general
                      (is_last,(int)sVar1,iVar11,iVar14,uVar10,dc_sign_ctx,txb_costs,bhl,tx_class,
                       levels);
    if (iVar11 == 1) {
      iVar3 = txb_costs->base_cost[(int)uVar10][0];
      iVar11 = 0;
      iVar12 = 0;
      abs_qc = 0;
      uVar4 = uVar17;
    }
    else {
      abs_qc = iVar11 - 1;
      iVar12 = ((int)(iVar12 * abs_qc) >> (bVar6 & 0x1f) ^ uVar13) + iVar14;
      lVar8 = (long)(iVar3 - iVar12 << (bVar6 & 0x1f));
      if (qmatrix == (qm_val_t *)0x0) {
        uVar4 = lVar8 * lVar8;
      }
      else {
        uVar4 = (ulong)qmatrix[lVar15] * lVar8 * (ulong)qmatrix[lVar15] * lVar8 + 0x200 >> 10;
      }
      iVar11 = (abs_qc ^ uVar13) + iVar14;
      iVar3 = get_coeff_cost_general
                        (is_last,(int)sVar1,abs_qc,iVar14,uVar10,dc_sign_ctx,txb_costs,bhl,tx_class,
                         levels);
    }
    if ((long)(uVar4 * 0x80 + (iVar3 * rdmult + 0x100 >> 9)) <
        (long)(uVar9 * 0x80 + (iVar2 * rdmult + 0x100 >> 9))) {
      qcoeff[lVar15] = iVar11;
      dqcoeff[lVar15] = iVar12;
      uVar7 = '\x7f';
      if (abs_qc < 0x7f) {
        uVar7 = (uint8_t)abs_qc;
      }
      levels[(int)sVar1 + ((int)sVar1 >> (bVar5 & 0x1f)) * 4] = uVar7;
      uVar9 = uVar4;
      iVar2 = iVar3;
    }
    lVar15 = *accu_dist;
    *accu_rate = *accu_rate + iVar2;
    *accu_dist = (uVar9 - uVar17) + lVar15;
  }
  return;
}

Assistant:

static inline void update_coeff_general(
    int *accu_rate, int64_t *accu_dist, int si, int eob, TX_SIZE tx_size,
    TX_CLASS tx_class, int bhl, int width, int64_t rdmult, int shift,
    int dc_sign_ctx, const int16_t *dequant, const int16_t *scan,
    const LV_MAP_COEFF_COST *txb_costs, const tran_low_t *tcoeff,
    tran_low_t *qcoeff, tran_low_t *dqcoeff, uint8_t *levels,
    const qm_val_t *iqmatrix, const qm_val_t *qmatrix) {
  const int dqv = get_dqv(dequant, scan[si], iqmatrix);
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const int is_last = si == (eob - 1);
  const int coeff_ctx = get_lower_levels_ctx_general(
      is_last, si, bhl, width, levels, ci, tx_size, tx_class);
  if (qc == 0) {
    *accu_rate += txb_costs->base_cost[coeff_ctx][0];
  } else {
    const int sign = (qc < 0) ? 1 : 0;
    const tran_low_t abs_qc = abs(qc);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    const int rate =
        get_coeff_cost_general(is_last, ci, abs_qc, sign, coeff_ctx,
                               dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    const int64_t rd = RDCOST(rdmult, rate, dist);

    tran_low_t qc_low, dqc_low;
    tran_low_t abs_qc_low;
    int64_t dist_low, rd_low;
    int rate_low;
    if (abs_qc == 1) {
      abs_qc_low = qc_low = dqc_low = 0;
      dist_low = dist0;
      rate_low = txb_costs->base_cost[coeff_ctx][0];
    } else {
      get_qc_dqc_low(abs_qc, sign, dqv, shift, &qc_low, &dqc_low);
      abs_qc_low = abs_qc - 1;
      dist_low = get_coeff_dist(tqc, dqc_low, shift, qmatrix, ci);
      rate_low =
          get_coeff_cost_general(is_last, ci, abs_qc_low, sign, coeff_ctx,
                                 dc_sign_ctx, txb_costs, bhl, tx_class, levels);
    }

    rd_low = RDCOST(rdmult, rate_low, dist_low);
    if (rd_low < rd) {
      qcoeff[ci] = qc_low;
      dqcoeff[ci] = dqc_low;
      levels[get_padded_idx(ci, bhl)] = AOMMIN(abs_qc_low, INT8_MAX);
      *accu_rate += rate_low;
      *accu_dist += dist_low - dist0;
    } else {
      *accu_rate += rate;
      *accu_dist += dist - dist0;
    }
  }
}